

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O3

ssize_t __thiscall
SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::write
          (ServerBase<asio::basic_stream_socket<asio::ip::tcp>_> *this,int __fd,void *__buf,
          size_t __n)

{
  Response *this_00;
  ssize_t sVar1;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  undefined4 in_register_00000034;
  long *plVar2;
  shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response> response;
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined8 local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session> local_40;
  undefined8 local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  Connection::set_timeout(*(Connection **)*plVar2,(this->config).timeout_content);
  this_00 = (Response *)operator_new(0x170);
  local_40.
  super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)*plVar2;
  local_40.
  super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
  if (local_40.
      super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.
       super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.
       super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Response::Response(this_00,&local_40,(this->config).timeout_content);
  std::
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response,SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::write(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Session>const&,std::function<void(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response>,std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Request>)>&)::_lambda(SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response*)_1_,void>
            ((__shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response,(__gnu_cxx::_Lock_policy)2>
              *)&local_30,this_00,(anon_class_8_1_8991fb9c_for__M_tp)this);
  if (local_40.
      super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_50 = local_30;
  local_48 = local_28;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  local_60 = *(undefined8 *)(*plVar2 + 0x10);
  local_58 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*plVar2 + 0x18);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  if (*(long *)((long)__buf + 0x10) != 0) {
    sVar1 = (**(code **)((long)__buf + 0x18))(__buf,&local_50,&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      sVar1 = extraout_RAX;
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      sVar1 = extraout_RAX_00;
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      sVar1 = extraout_RAX_01;
    }
    return sVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

void write(const std::shared_ptr<Session> &session,
               std::function<void(std::shared_ptr<typename ServerBase<socket_type>::Response>, std::shared_ptr<typename ServerBase<socket_type>::Request>)> &resource_function) {
      session->connection->set_timeout(config.timeout_content);
      auto response = std::shared_ptr<Response>(new Response(session, config.timeout_content), [this](Response *response_ptr) {
        auto response = std::shared_ptr<Response>(response_ptr);
        response->send_on_delete([this, response](const error_code &ec) {
          if(!ec) {
            if(response->close_connection_after_response)
              return;

            auto range = response->session->request->header.equal_range("Connection");
            for(auto it = range.first; it != range.second; it++) {
              if(case_insensitive_equal(it->second, "close"))
                return;
              else if(case_insensitive_equal(it->second, "keep-alive")) {
                auto new_session = std::make_shared<Session>(this->config.max_request_streambuf_size, response->session->connection);
                this->read(new_session);
                return;
              }
            }
            if(response->session->request->http_version >= "1.1") {
              auto new_session = std::make_shared<Session>(this->config.max_request_streambuf_size, response->session->connection);
              this->read(new_session);
              return;
            }
          }
          else if(this->on_error)
            this->on_error(response->session->request, ec);
        });
      });

      try {
        resource_function(response, session->request);
      }
      catch(const std::exception &) {
        if(on_error)
          on_error(session->request, make_error_code::make_error_code(errc::operation_canceled));
        return;
      }
    }